

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O0

void __thiscall
jsonnet::internal::NoRedundantSliceColon::visit(NoRedundantSliceColon *this,Index *expr)

{
  size_type sVar1;
  CompilerPass *in_RSI;
  Index *in_RDI;
  Fodder *unaff_retaddr;
  Index *b;
  
  if (((((ulong)in_RSI[10]._vptr_CompilerPass & 1) != 0) && (in_RSI[0xe].alloc == (Allocator *)0x0))
     && (b = in_RDI,
        sVar1 = std::
                vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                ::size((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                        *)(in_RSI + 0xd)), sVar1 != 0)) {
    fodder_move_front(unaff_retaddr,(Fodder *)b);
  }
  CompilerPass::visit(in_RSI,in_RDI);
  return;
}

Assistant:

void visit(Index *expr)
    {
        if (expr->isSlice) {
            if (expr->step == nullptr) {
                if (expr->stepColonFodder.size() > 0) {
                    fodder_move_front(expr->idFodder, expr->stepColonFodder);
                }
            }
        }
        FmtPass::visit(expr);
    }